

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_bcc(m68k_info *info,int size,int displacement)

{
  byte bVar1;
  
  MCInst_setOpcode(info->inst,*(uint *)((long)s_branch_lut + (ulong)(info->ir >> 6 & 0x3c)));
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  (info->extension).operands[0].type = M68K_OP_BR_DISP;
  (info->extension).operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  (info->extension).operands[0].br_disp.disp = displacement;
  (info->extension).operands[0].br_disp.disp_size = (uint8_t)size;
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\a';
  return;
}

Assistant:

static void build_bcc(m68k_info *info, int size, int displacement)
{
	build_relative_branch(info, s_branch_lut[(info->ir >> 8) & 0xf], size, displacement);
}